

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::JavaGenerator::GenGetterForLookupByKey
          (string *__return_storage_ptr__,JavaGenerator *this,FieldDef *key_field,
          string *data_buffer,char *num)

{
  bool bVar1;
  string sStack_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string dest_cast;
  string dest_mask;
  Type type;
  
  type.base_type = (key_field->value).type.base_type;
  type.element = (key_field->value).type.element;
  type.struct_def = (key_field->value).type.struct_def;
  type.enum_def = (key_field->value).type.enum_def;
  type.fixed_length = (key_field->value).type.fixed_length;
  type._26_6_ = *(undefined6 *)&(key_field->value).type.field_0x1a;
  DestinationMask_abi_cxx11_(&dest_mask,this,&type,true);
  DestinationCast_abi_cxx11_(&dest_cast,this,&type);
  std::operator+(__return_storage_ptr__,data_buffer,".get");
  GenTypeBasic_abi_cxx11_(&sStack_158,this,&type);
  bVar1 = std::operator!=(&sStack_158,"byte");
  std::__cxx11::string::~string((string *)&sStack_158);
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(&local_138,this,&type);
    ConvertCase(&sStack_158,&local_138,kUpperCamel,kSnake);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_158);
    std::__cxx11::string::~string((string *)&local_138);
  }
  std::operator+(&local_f8,&dest_cast,__return_storage_ptr__);
  std::operator+(&local_d8,&local_f8,"(");
  GenOffsetGetter_abi_cxx11_(&local_118,this,key_field,num);
  std::operator+(&local_b8,&local_d8,&local_118);
  std::operator+(&local_138,&local_b8,")");
  std::operator+(&sStack_158,&local_138,&dest_mask);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_158);
  std::__cxx11::string::~string((string *)&sStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&dest_cast);
  std::__cxx11::string::~string((string *)&dest_mask);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetterForLookupByKey(flatbuffers::FieldDef *key_field,
                                      const std::string &data_buffer,
                                      const char *num = nullptr) const {
    auto type = key_field->value.type;
    auto dest_mask = DestinationMask(type, true);
    auto dest_cast = DestinationCast(type);
    auto getter = data_buffer + ".get";
    if (GenTypeBasic(type) != "byte") {
      getter += ConvertCase(GenTypeBasic(type), Case::kUpperCamel);
    }
    getter = dest_cast + getter + "(" + GenOffsetGetter(key_field, num) + ")" +
             dest_mask;
    return getter;
  }